

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_specific_extensions.cpp
# Opt level: O0

void __thiscall
tlm_utils::instance_specific_extension_container::~instance_specific_extension_container
          (instance_specific_extension_container *this)

{
  instance_specific_extensions_per_accessor *piVar1;
  size_type sVar2;
  reference ppiVar3;
  vector<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
  *in_RDI;
  uint i;
  vector<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
  *in_stack_ffffffffffffffe0;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    sVar2 = std::
            vector<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
            ::size(in_RDI);
    if (sVar2 <= local_c) break;
    ppiVar3 = std::
              vector<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
              ::operator[](in_RDI,(ulong)local_c);
    piVar1 = *ppiVar3;
    if (piVar1 != (instance_specific_extensions_per_accessor *)0x0) {
      instance_specific_extensions_per_accessor::~instance_specific_extensions_per_accessor
                ((instance_specific_extensions_per_accessor *)0x2fbec6);
      operator_delete(piVar1);
    }
    local_c = local_c + 1;
  }
  std::
  vector<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
  ::~vector(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

instance_specific_extension_container::
  ~instance_specific_extension_container()
{
  for (unsigned int i=0; i<m_ispex_per_accessor.size(); ++i)
    delete m_ispex_per_accessor[i];
}